

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O1

void __thiscall
tyti::stl::
stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser(stl_parser<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  undefined1 *puVar1;
  parser_binder<boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>,_boost::fusion::cons<boost::spirit::qi::lexeme_directive<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_boost::fusion::nil_>_>_>,_mpl_::bool_<true>_>
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  puVar1 = &local_58.p.elements.cdr.field_0x8;
  local_58.p.elements.car.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unnamed-grammar","");
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->start;
  local_38 = &(this->
              super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              ).name_.field_2;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->
              super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              ).name_,local_58.p.elements.car.ref.t_,
             (undefined1 *)
             ((long)local_58.p.elements.cdr.car.subject.ref.t_ +
             (long)local_58.p.elements.car.ref.t_));
  if (local_58.p.elements.car.ref.t_ !=
      (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
       )puVar1) {
    operator_delete((void *)local_58.p.elements.car.ref.t_,local_58.p.elements.cdr._8_8_ + 1);
  }
  stl_parser_ascii<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::stl_parser_ascii(&this->stl_ascii_);
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::stl_parser_binary(&this->stl_binary_);
  local_58.p.elements.car.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unnamed-rule","");
  (this->start).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->start;
  (this->start).name_._M_dataplus._M_p = (pointer)&(this->start).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->start).name_,local_58.p.elements.car.ref.t_,
             (undefined1 *)
             ((long)local_58.p.elements.cdr.car.subject.ref.t_ +
             (long)local_58.p.elements.car.ref.t_));
  (this->start).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<double>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_58.p.elements.car.ref.t_ !=
      (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
       )puVar1) {
    operator_delete((void *)local_58.p.elements.car.ref.t_,local_58.p.elements.cdr._8_8_ + 1);
  }
  local_58.p.elements.cdr.car.subject.ref.t_ =
       (reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(this->stl_binary_).
         super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
         .
         super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
         .proto_expr_.child0.ref.t_;
  local_58.p.elements.car.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(this->stl_ascii_).
         super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
         .
         super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
         .proto_expr_.child0.ref.t_;
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<double>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<double>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>const&)>
               *)&(this->start).f,&local_58);
  return;
}

Assistant:

stl_parser() : stl_parser::base_type(start)
            {
                start %= stl_ascii_ | boost::spirit::qi::lexeme[stl_binary_];
            }